

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QMetaMethod __thiscall
QMetaObjectPrivate::firstMethod
          (QMetaObjectPrivate *this,QMetaObject *baseObject,QByteArrayView name)

{
  QMetaMethod QVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  QByteArray local_60;
  QMetaMethod local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = this == (QMetaObjectPrivate *)0x0;
  do {
    if (bVar6) {
LAB_00282f52:
      local_48.mobj = (QMetaObject *)0x0;
      local_48.data.d = (uint *)0x0;
LAB_00282f5a:
      QVar1.data.d = local_48.data.d;
      QVar1.mobj = local_48.mobj;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return QVar1;
      }
      __stack_chk_fail();
    }
    lVar4 = (long)*(int *)(*(long *)&this->methodCount + 0x10);
    lVar3 = lVar4 * 0x18;
    lVar4 = lVar4 + 1;
    do {
      lVar3 = lVar3 + -0x18;
      lVar5 = lVar4 + -1;
      if (lVar5 == 0 || lVar4 < 1) goto LAB_00282f43;
      local_48.data.d =
           (uint *)(*(long *)&this->methodCount +
                    (long)*(int *)(*(long *)&this->methodCount + 0x14) * 4 + lVar3);
      local_48.mobj = (QMetaObject *)this;
      QMetaMethod::name(&local_60,&local_48);
      bVar7 = (QMetaObject *)local_60.d.size == baseObject;
      if (bVar7 && baseObject != (QMetaObject *)0x0) {
        iVar2 = bcmp((void *)name.m_size,local_60.d.ptr,(size_t)baseObject);
        bVar7 = iVar2 == 0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      lVar4 = lVar5;
    } while (!bVar7);
    if (0 < lVar5) {
      if (!bVar6) goto LAB_00282f5a;
      goto LAB_00282f52;
    }
LAB_00282f43:
    this = *(QMetaObjectPrivate **)this;
    bVar6 = this == (QMetaObjectPrivate *)0x0;
  } while( true );
}

Assistant:

QMetaMethod QMetaObjectPrivate::firstMethod(const QMetaObject *baseObject, QByteArrayView name)
{
    for (const QMetaObject *currentObject = baseObject; currentObject; currentObject = currentObject->superClass()) {
        const int start = priv(currentObject->d.data)->methodCount - 1;
        const int end = 0;
        for (int i = start; i >= end; --i) {
            auto candidate = QMetaMethod::fromRelativeMethodIndex(currentObject, i);
            if (name == candidate.name())
                return candidate;
        }
    }
    return QMetaMethod{};
}